

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O0

void __thiscall PF_HashTable::~PF_HashTable(PF_HashTable *this)

{
  PF_HashEntry *pPVar1;
  PF_HashEntry *next;
  PF_HashEntry *entry;
  int i;
  PF_HashTable *this_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < this->numBuckets; entry._4_4_ = entry._4_4_ + 1) {
    pPVar1 = this->hashTable[entry._4_4_];
    while (next = pPVar1, next != (PF_HashEntry *)0x0) {
      pPVar1 = next->next;
      if (next != (PF_HashEntry *)0x0) {
        operator_delete(next);
      }
    }
  }
  if (this->hashTable != (PF_HashEntry **)0x0) {
    operator_delete__(this->hashTable);
  }
  return;
}

Assistant:

PF_HashTable::~PF_HashTable()
{
  // Clear out all buckets
  for (int i = 0; i < numBuckets; i++) {

    // Delete all entries in the bucket
    PF_HashEntry *entry = hashTable[i];
    while (entry != NULL) {
      PF_HashEntry *next = entry->next;
      delete entry;
      entry = next;
    }
  }

  // Finally delete the hash table
  delete[] hashTable;
}